

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuInterval.cpp
# Opt level: O1

int __thiscall tcu::abs(tcu *this,int __x)

{
  double *pdVar1;
  double dVar2;
  char *pcVar3;
  deRoundingMode dVar4;
  tcu tVar5;
  undefined4 in_register_00000034;
  tcu tVar6;
  ulong uVar7;
  double dVar8;
  ulong uVar9;
  double dVar10;
  double dVar11;
  double local_68;
  
  pcVar3 = (char *)CONCAT44(in_register_00000034,__x);
  dVar11 = *(double *)(CONCAT44(in_register_00000034,__x) + 8);
  pdVar1 = (double *)(CONCAT44(in_register_00000034,__x) + 0x10);
  if (dVar11 < *pdVar1 || dVar11 == *pdVar1) {
    dVar4 = deGetRoundingMode();
    deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
    local_68 = ABS(dVar11);
    if (NAN(dVar11)) {
      local_68 = INFINITY;
    }
    deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
    deSetRoundingMode(dVar4);
    dVar2 = *(double *)(pcVar3 + 0x10);
    dVar4 = deGetRoundingMode();
    deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
    dVar8 = ABS(dVar2);
    if (NAN(dVar2)) {
      dVar8 = INFINITY;
    }
    deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
    deSetRoundingMode(dVar4);
    dVar10 = (double)(~-(ulong)NAN(dVar11) & (ulong)ABS(dVar11) |
                     -(ulong)NAN(dVar11) & 0xfff0000000000000);
    tVar6 = (tcu)(NAN(dVar11) || NAN(dVar2));
    dVar11 = (double)(~-(ulong)NAN(dVar2) & (ulong)ABS(dVar2) |
                     -(ulong)NAN(dVar2) & 0xfff0000000000000);
    uVar9 = ~-(ulong)(local_68 <= dVar8) & (ulong)dVar8 |
            (ulong)local_68 & -(ulong)(local_68 <= dVar8);
    uVar7 = -(ulong)(dVar11 <= dVar10);
    dVar11 = (double)(~uVar7 & (ulong)dVar11 | uVar7 & (ulong)dVar10);
  }
  else {
    dVar11 = -INFINITY;
    uVar9 = 0x7ff0000000000000;
    tVar6 = (tcu)0x0;
  }
  tVar5 = (tcu)0x1;
  if (*pcVar3 == '\0') {
    tVar5 = tVar6;
  }
  dVar2 = *(double *)(pcVar3 + 8);
  dVar8 = *(double *)(pcVar3 + 0x10);
  *this = tVar5;
  if ((0.0 < dVar2) || (dVar8 < 0.0)) {
    *(ulong *)(this + 8) = uVar9;
  }
  else {
    *(undefined8 *)(this + 8) = 0;
    dVar11 = (double)(~-(ulong)(dVar11 <= 0.0) & (ulong)dVar11);
  }
  *(double *)(this + 0x10) = dVar11;
  return (int)this;
}

Assistant:

Interval abs (const Interval& x)
{
	const Interval mono = applyMonotone(std::abs, x);

	if (x.contains(0.0))
		return Interval(0.0, mono);

	return mono;
}